

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

DropIndicatorPosition __thiscall
QListModeViewBase::position(QListModeViewBase *this,QPoint *pos,QRect *rect,QModelIndex *index)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char cVar7;
  uint uVar8;
  DropIndicatorPosition DVar9;
  QPoint QVar10;
  QRect *pQVar11;
  long in_FS_OFFSET;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).overwrite == false) {
    iVar1 = (pos->xp).m_i;
    if (iVar1 - (rect->x1).m_i < 2) {
      DVar9 = AboveItem;
      goto LAB_005162a3;
    }
    pQVar11 = rect;
    if ((rect->x2).m_i - iVar1 < 2) {
      DVar9 = BelowItem;
      goto LAB_005162a3;
    }
  }
  else {
    uVar3 = rect->x1;
    uVar4 = rect->y1;
    uVar5 = rect->x2;
    uVar6 = rect->y2;
    local_48.y1.m_i = uVar4 + -1;
    local_48.x1.m_i = uVar3 + -1;
    local_48.y2.m_i = uVar6 + 1;
    local_48.x2.m_i = uVar5 + 1;
    pQVar11 = &local_48;
  }
  cVar7 = QRect::contains((QPoint *)pQVar11,SUB81(pos,0));
  if (cVar7 == '\0') {
    DVar9 = OnViewport;
  }
  else {
    pQVar2 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).model;
    uVar8 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,index);
    DVar9 = OnItem;
    if ((uVar8 & 8) == 0) {
      iVar1 = (pos->xp).m_i;
      QVar10 = QRect::center(rect);
      DVar9 = (QVar10.xp.m_i.m_i <= iVar1) + AboveItem;
    }
  }
LAB_005162a3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return DVar9;
}

Assistant:

QAbstractItemView::DropIndicatorPosition QListModeViewBase::position(const QPoint &pos, const QRect &rect, const QModelIndex &index) const
{
    QAbstractItemView::DropIndicatorPosition r = QAbstractItemView::OnViewport;
    if (!dd->overwrite) {
        const int margin = 2;
        if (pos.x() - rect.left() < margin) {
            r = QAbstractItemView::AboveItem;   // Visually, on the left
        } else if (rect.right() - pos.x() < margin) {
            r = QAbstractItemView::BelowItem;   // Visually, on the right
        } else if (rect.contains(pos, true)) {
            r = QAbstractItemView::OnItem;
        }
    } else {
        QRect touchingRect = rect;
        touchingRect.adjust(-1, -1, 1, 1);
        if (touchingRect.contains(pos, false)) {
            r = QAbstractItemView::OnItem;
        }
    }

    if (r == QAbstractItemView::OnItem && (!(dd->model->flags(index) & Qt::ItemIsDropEnabled)))
        r = pos.x() < rect.center().x() ? QAbstractItemView::AboveItem : QAbstractItemView::BelowItem;

    return r;
}